

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  _Base_ptr *pp_Var1;
  char *pcVar2;
  Context *context;
  long *plVar3;
  long *plVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  mapped_type *pmVar8;
  ImmutableFieldLiteGenerator *pIVar9;
  Descriptor *pDVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int i;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  long extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 uVar11;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_13;
  int iVar12;
  long lVar13;
  uint uVar14;
  OneofDescriptor *oneof;
  char *pcVar15;
  long lVar16;
  SubstituteArg *in_stack_fffffffffffffd28;
  ImmutableMessageLiteGenerator messageGenerator;
  undefined1 local_278 [48];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  string builder_type;
  string local_1c0;
  string local_1a0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  pDVar10 = (this->super_MessageGenerator).descriptor_;
  if (*(long *)(pDVar10 + 0x18) == 0) {
    pcVar15 = " static ";
    if (*(char *)(*(long *)(*(long *)(pDVar10 + 0x10) + 0xa0) + 0xa0) != '\0') {
      pcVar15 = " ";
    }
  }
  else {
    pcVar15 = " static ";
  }
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_impl.super__Rb_tree_header._M_header;
  local_218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_impl.super__Rb_tree_header._M_node_count = 0;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  local_218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"static","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_218,(key_type *)&messageGenerator);
  pcVar2 = (char *)pmVar8->_M_string_length;
  strlen(pcVar15);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar2,(ulong)pcVar15);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"classname","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_218,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar8);
  pDVar10 = extraout_RDX;
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
    pDVar10 = extraout_RDX_00;
  }
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,pDVar10)
  ;
  pp_Var1 = &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  vars._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"extra_interfaces","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_218,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)&messageGenerator);
  if ((_Base_ptr *)vars._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)vars._M_t._M_impl._0_8_,
                    (ulong)((long)&(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  pcVar15 = "";
  if (*(char *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x20) + 0x6a) != '\0') {
    pcVar15 = "@java.lang.Deprecated ";
  }
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"deprecation","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_218,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_replace((ulong)pmVar8,0,(char *)pmVar8->_M_string_length,(ulong)pcVar15);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar10 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
       (_func_int **)&messageGenerator.context_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar10,true,(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x68) < 1) {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_218,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    std::__cxx11::string::_M_replace
              ((ulong)&builder_type,0,(char *)builder_type._M_string_length,0x36fc7d);
  }
  else {
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_218,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_1c0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_1c0._M_dataplus._M_p;
    messageGenerator.super_MessageGenerator.descriptor_._0_4_ =
         (undefined4)local_1c0._M_string_length;
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    local_278._0_8_ = (char *)0x0;
    local_278._8_4_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_1a0,
               (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,(SubstituteArg *)local_278,&local_60
               ,&local_90,&local_c0,&local_f0,&local_120,&local_150,&local_180,
               in_stack_fffffffffffffd28);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Indent(printer);
  GenerateConstructor(this,printer);
  pDVar10 = (this->super_MessageGenerator).descriptor_;
  field = extraout_RDX_01;
  if (0 < *(int *)(pDVar10 + 0x58)) {
    lVar13 = 0;
    lVar16 = 0;
    do {
      EnumLiteGenerator::EnumLiteGenerator
                ((EnumLiteGenerator *)&messageGenerator,
                 (EnumDescriptor *)(*(long *)(pDVar10 + 0x60) + lVar13),true,this->context_);
      EnumLiteGenerator::Generate((EnumLiteGenerator *)&messageGenerator,printer);
      EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&messageGenerator);
      lVar16 = lVar16 + 1;
      pDVar10 = (this->super_MessageGenerator).descriptor_;
      lVar13 = lVar13 + 0x38;
      field = extraout_RDX_02;
    } while (lVar16 < *(int *)(pDVar10 + 0x58));
  }
  if (0 < *(int *)(pDVar10 + 0x48)) {
    lVar13 = 0;
    lVar16 = 0;
    do {
      if (*(char *)(*(long *)(*(long *)(pDVar10 + 0x50) + 0x20 + lVar13) + 0x6b) == '\0') {
        ImmutableMessageLiteGenerator
                  (&messageGenerator,(Descriptor *)(*(long *)(pDVar10 + 0x50) + lVar13),
                   this->context_);
        GenerateInterface(&messageGenerator,printer);
        Generate(&messageGenerator,printer);
        messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
             (_func_int **)&PTR__ImmutableMessageLiteGenerator_004216f0;
        FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
        ~FieldGeneratorMap(&messageGenerator.field_generators_);
        MessageGenerator::~MessageGenerator(&messageGenerator.super_MessageGenerator);
        pDVar10 = (this->super_MessageGenerator).descriptor_;
        field = extraout_RDX_03;
      }
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0xa8;
    } while (lVar16 < *(int *)(pDVar10 + 0x48));
  }
  if (*(int *)(*(long *)(pDVar10 + 0x10) + 0x8c) == 3) {
    bVar6 = HasRepeatedFields(pDVar10);
    pDVar10 = (this->super_MessageGenerator).descriptor_;
    field = extraout_RDX_04;
    if (!bVar6) goto LAB_00274378;
  }
  if (0 < *(int *)(pDVar10 + 0x2c)) {
    lVar16 = 0;
    lVar13 = 0;
    iVar12 = 0;
    do {
      pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar10 + 0x30) + lVar16));
      iVar7 = (*pIVar9->_vptr_ImmutableFieldLiteGenerator[2])(pIVar9);
      iVar12 = iVar12 + iVar7;
      lVar13 = lVar13 + 1;
      pDVar10 = (this->super_MessageGenerator).descriptor_;
      lVar16 = lVar16 + 0xa8;
    } while (lVar13 < *(int *)(pDVar10 + 0x2c));
    field = extraout_RDX_05;
    if (0 < iVar12) {
      uVar14 = 0;
      do {
        GetBitFieldName_abi_cxx11_((string *)&messageGenerator,(java *)(ulong)uVar14,(int)field);
        io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                           (string *)&messageGenerator);
        field = extraout_RDX_06;
        if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
            &messageGenerator.context_) {
          operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                          (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
          field = extraout_RDX_07;
        }
        uVar14 = uVar14 + 1;
      } while (iVar12 + 0x1fU >> 5 != uVar14);
      pDVar10 = (this->super_MessageGenerator).descriptor_;
    }
  }
LAB_00274378:
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(pDVar10 + 0x38)) {
    field = (FieldDescriptor *)0x0;
    do {
      oneof = (OneofDescriptor *)((long)field * 0x30 + *(long *)(pDVar10 + 0x40));
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&messageGenerator,"oneof_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
      }
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&messageGenerator,"oneof_capitalized_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&messageGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      iVar12 = extraout_EDX;
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
        iVar12 = extraout_EDX_00;
      }
      SimpleItoa_abi_cxx11_
                ((string *)&messageGenerator,
                 (protobuf *)
                 (ulong)(uint)((int)((ulong)((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x40)
                                            ) >> 4) * -0x55555555),iVar12);
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"oneof_index","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(string *)local_278);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&messageGenerator);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
      }
      io::Printer::Print(printer,&vars,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(printer,&vars,
                         "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite {\n"
                        );
      io::Printer::Indent(printer);
      if (0 < *(int *)(oneof + 0x1c)) {
        lVar13 = 0;
        do {
          plVar3 = *(long **)(*(long *)(oneof + 0x20) + lVar13 * 8);
          plVar4 = (long *)*plVar3;
          messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
               (_func_int **)&messageGenerator.context_;
          lVar16 = *plVar4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&messageGenerator,lVar16,plVar4[1] + lVar16);
          lVar16 = extraout_RDX_08;
          if (CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                       messageGenerator.super_MessageGenerator.descriptor_._0_4_) != 0) {
            lVar16 = 0;
            do {
              if ((byte)(*(char *)((long)messageGenerator.super_MessageGenerator.
                                         _vptr_MessageGenerator + lVar16) + 0x9fU) < 0x1a) {
                *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                         lVar16) =
                     *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                              + lVar16) + -0x20;
              }
              lVar16 = lVar16 + 1;
            } while (CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                              messageGenerator.super_MessageGenerator.descriptor_._0_4_) != lVar16);
          }
          SimpleItoa_abi_cxx11_
                    ((string *)local_278,(protobuf *)(ulong)*(uint *)(plVar3 + 7),(int)lVar16);
          io::Printer::Print(printer,"$field_name$($field_number$),\n","field_name",
                             (string *)&messageGenerator,"field_number",(string *)local_278);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
              &messageGenerator.context_) {
            operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                            (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(oneof + 0x1c));
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"oneof_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(string *)local_278);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar5 = (pmVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar5,pcVar5 + pmVar8->_M_string_length);
      if (CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                   messageGenerator.super_MessageGenerator.descriptor_._0_4_) != 0) {
        lVar13 = 0;
        do {
          if ((byte)(*(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                              + lVar13) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator + lVar13)
                 = *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            lVar13) + -0x20;
          }
          lVar13 = lVar13 + 1;
        } while (CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                          messageGenerator.super_MessageGenerator.descriptor_._0_4_) != lVar13);
      }
      io::Printer::Print(printer,"$cap_oneof_name$_NOT_SET(0);\n","cap_oneof_name",
                         (string *)&messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      io::Printer::Print(printer,&vars,
                         "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                        );
      io::Printer::Print(printer,&vars,
                         "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                        );
      if (0 < *(int *)(oneof + 0x1c)) {
        lVar13 = 0;
        uVar11 = extraout_RDX_09;
        do {
          plVar3 = *(long **)(*(long *)(oneof + 0x20) + lVar13 * 8);
          SimpleItoa_abi_cxx11_
                    ((string *)&messageGenerator,(protobuf *)(ulong)*(uint *)(plVar3 + 7),
                     (int)uVar11);
          plVar3 = (long *)*plVar3;
          local_278._0_8_ = local_278 + 0x10;
          lVar16 = *plVar3;
          std::__cxx11::string::_M_construct<char*>((string *)local_278,lVar16,plVar3[1] + lVar16);
          if (CONCAT44(local_278._12_4_,local_278._8_4_) != 0) {
            lVar16 = 0;
            do {
              if ((byte)(*(char *)(local_278._0_8_ + lVar16) + 0x9fU) < 0x1a) {
                *(char *)(local_278._0_8_ + lVar16) = *(char *)(local_278._0_8_ + lVar16) + -0x20;
              }
              lVar16 = lVar16 + 1;
            } while (CONCAT44(local_278._12_4_,local_278._8_4_) != lVar16);
          }
          io::Printer::Print(printer,"    case $field_number$: return $field_name$;\n",
                             "field_number",(string *)&messageGenerator,"field_name",
                             (string *)local_278);
          uVar11 = extraout_RDX_10;
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            uVar11 = extraout_RDX_11;
          }
          if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
              &messageGenerator.context_) {
            operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                            (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
            uVar11 = extraout_RDX_12;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(oneof + 0x1c));
      }
      local_278._0_8_ = local_278 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"oneof_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(string *)local_278);
      messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
           (_func_int **)&messageGenerator.context_;
      pcVar5 = (pmVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&messageGenerator,pcVar5,pcVar5 + pmVar8->_M_string_length);
      if (CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                   messageGenerator.super_MessageGenerator.descriptor_._0_4_) != 0) {
        lVar13 = 0;
        do {
          if ((byte)(*(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator
                              + lVar13) + 0x9fU) < 0x1a) {
            *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator + lVar13)
                 = *(char *)((long)messageGenerator.super_MessageGenerator._vptr_MessageGenerator +
                            lVar13) + -0x20;
          }
          lVar13 = lVar13 + 1;
        } while (CONCAT44(messageGenerator.super_MessageGenerator.descriptor_._4_4_,
                          messageGenerator.super_MessageGenerator.descriptor_._0_4_) != lVar13);
      }
      io::Printer::Print(printer,
                         "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                         ,"cap_oneof_name",(string *)&messageGenerator);
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
      }
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"};\n\n");
      io::Printer::Print(printer,&vars,
                         "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\nprivate void clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
                        );
      field = field + 1;
      pDVar10 = (this->super_MessageGenerator).descriptor_;
    } while ((long)field < (long)*(int *)(pDVar10 + 0x38));
  }
  if (0 < *(int *)(pDVar10 + 0x2c)) {
    lVar16 = 0;
    lVar13 = 0;
    do {
      FieldConstantName_abi_cxx11_
                ((string *)&messageGenerator,(java *)(*(long *)(pDVar10 + 0x30) + lVar16),field);
      SimpleItoa_abi_cxx11_
                ((string *)local_278,
                 (protobuf *)
                 (ulong)*(uint *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x30) +
                                  0x38 + lVar16),i);
      io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                         "constant_name",(string *)&messageGenerator,"number",(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
      }
      if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
          &messageGenerator.context_) {
        operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                        (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
      }
      pIVar9 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)
                          (*(long *)((this->super_MessageGenerator).descriptor_ + 0x30) + lVar16));
      (*pIVar9->_vptr_ImmutableFieldLiteGenerator[5])(pIVar9,printer);
      io::Printer::Print(printer,"\n");
      lVar13 = lVar13 + 1;
      pDVar10 = (this->super_MessageGenerator).descriptor_;
      lVar16 = lVar16 + 0xa8;
      field = extraout_RDX_13;
    } while (lVar13 < *(int *)(pDVar10 + 0x2c));
  }
  GenerateMessageSerializationMethods(this,printer);
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  bVar6 = HasRequiredFields((this->super_MessageGenerator).descriptor_);
  if (bVar6) {
    io::Printer::Print(printer,"private byte memoizedIsInitialized = -1;\n");
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,
                     "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\nprotected final Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    Object arg0, Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
                     ,"classname",(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"case IS_INITIALIZED: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodIsInitialized(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase MAKE_IMMUTABLE: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodMakeImmutable(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase NEW_BUILDER: {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"return new Builder();\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase VISIT: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodVisit(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase MERGE_FROM_STREAM: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodMergeFromStream(this,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,
                     "}\n// fall through\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  if (PARSER == null) {    synchronized ($classname$.class) {\n      if (PARSER == null) {\n        PARSER = new DefaultInstanceBasedParser(DEFAULT_INSTANCE);\n      }\n    }\n  }\n  return PARSER;\n}\n"
                     ,"classname",(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,"  }\n  throw new UnsupportedOperationException();\n}\n\n","classname",
                     (string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)((this->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,"private static final $classname$ DEFAULT_INSTANCE;\n","classname",
                     (string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  io::Printer::Print(printer,
                     "static {\n  DEFAULT_INSTANCE = new $classname$();\n  DEFAULT_INSTANCE.makeImmutable();\n}\n\n"
                     ,"classname",*(string **)(this->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&messageGenerator,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_,true);
  io::Printer::Print(printer,
                     "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)&messageGenerator);
  if ((Context **)messageGenerator.super_MessageGenerator._vptr_MessageGenerator !=
      &messageGenerator.context_) {
    operator_delete(messageGenerator.super_MessageGenerator._vptr_MessageGenerator,
                    (ulong)((long)&((messageGenerator.context_)->name_resolver_).ptr_ + 1));
  }
  io::Printer::Print(printer,
                     "private static volatile com.google.protobuf.Parser<$classname$> PARSER;\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return DEFAULT_INSTANCE.getParserForType();\n}\n"
                     ,"classname",*(string **)(this->super_MessageGenerator).descriptor_);
  pDVar10 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar10 + 0x78)) {
    lVar13 = 0;
    lVar16 = 0;
    do {
      ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)&messageGenerator,
                 (FieldDescriptor *)(*(long *)(pDVar10 + 0x80) + lVar13),this->context_);
      ImmutableExtensionLiteGenerator::Generate
                ((ImmutableExtensionLiteGenerator *)&messageGenerator,printer);
      ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
                ((ImmutableExtensionLiteGenerator *)&messageGenerator);
      lVar16 = lVar16 + 1;
      pDVar10 = (this->super_MessageGenerator).descriptor_;
      lVar13 = lVar13 + 0xa8;
    } while (lVar16 < *(int *)(pDVar10 + 0x78));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)builder_type._M_dataplus._M_p != &builder_type.field_2) {
    operator_delete(builder_type._M_dataplus._M_p,
                    CONCAT71(builder_type.field_2._M_allocated_capacity._1_7_,
                             builder_type.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_218);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<string, string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] = descriptor_->options().deprecated()
      ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(variables,
      "$deprecation$public $static$final class $classname$ extends\n"
      "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
      "      $classname$, $classname$.Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(
        descriptor_->nested_type(i), context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        oneof)->capitalized_name;
    vars["oneof_index"] = SimpleItoa(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars,
      "public enum $oneof_capitalized_name$Case\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
        "$field_name$($field_number$),\n",
        "field_name",
        ToUpper(field->name()),
        "field_number",
        SimpleItoa(field->number()));
    }
    printer->Print(
      "$cap_oneof_name$_NOT_SET(0);\n",
      "cap_oneof_name",
      ToUpper(vars["oneof_name"]));
    printer->Print(vars,
      "private final int value;\n"
      "private $oneof_capitalized_name$Case(int value) {\n"
      "  this.value = value;\n"
      "}\n");
    printer->Print(vars,
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
      "  switch (value) {\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
        "    case $field_number$: return $field_name$;\n",
        "field_number",
        SimpleItoa(field->number()),
        "field_name",
        ToUpper(field->name()));
    }
    printer->Print(
      "    case 0: return $cap_oneof_name$_NOT_SET;\n"
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "public int getNumber() {\n"
      "  return this.value;\n"
      "}\n",
      "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n"
      "private void clear$oneof_capitalized_name$() {\n"
      "  $oneof_name$Case_ = 0;\n"
      "  $oneof_name$_ = null;\n"
      "}\n"
      "\n");
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateMessageSerializationMethods(printer);

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). -1 means not yet computed. 0 means false and 1 means
    // true.
    printer->Print(
      "private byte memoizedIsInitialized = -1;\n");
  }

  printer->Print(
    "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\n"
    "protected final Object dynamicMethod(\n"
    "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
    "    Object arg0, Object arg1) {\n"
    "  switch (method) {\n"
    "    case NEW_MUTABLE_INSTANCE: {\n"
    "      return new $classname$();\n"
    "    }\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print(
    "case IS_INITIALIZED: {\n");
  printer->Indent();
  GenerateDynamicMethodIsInitialized(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case MAKE_IMMUTABLE: {\n");

  printer->Indent();
  GenerateDynamicMethodMakeImmutable(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case VISIT: {\n");

  printer->Indent();
  GenerateDynamicMethodVisit(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case MERGE_FROM_STREAM: {\n");

  printer->Indent();
  GenerateDynamicMethodMergeFromStream(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "// fall through\n"
    "case GET_DEFAULT_INSTANCE: {\n"
    "  return DEFAULT_INSTANCE;\n"
    "}\n"
    "case GET_PARSER: {\n"
    // Generally one would use the lazy initialization holder pattern for
    // manipulating static fields but that has exceptional cost on Android as
    // it will generate an extra class for every message. Instead, use the
    // double-check locking pattern which works just as well.
    "  if (PARSER == null) {"
    "    synchronized ($classname$.class) {\n"
    "      if (PARSER == null) {\n"
    "        PARSER = new DefaultInstanceBasedParser(DEFAULT_INSTANCE);\n"
    "      }\n"
    "    }\n"
    "  }\n"
    "  return PARSER;\n"
    "}\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Outdent();
  printer->Outdent();

  printer->Print(
    "  }\n"
    "  throw new UnsupportedOperationException();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());


  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "private static final $classname$ DEFAULT_INSTANCE;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "static {\n"
    "  DEFAULT_INSTANCE = new $classname$();\n"
    "  DEFAULT_INSTANCE.makeImmutable();\n"
    "}\n"
    "\n",
    "classname", descriptor_->name());
  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}